

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QLoggingRule>::reallocateAndGrow
          (QArrayDataPointer<QLoggingRule> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QLoggingRule> *old)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  QLoggingRule *pQVar5;
  undefined1 *puVar6;
  bool bVar7;
  PatternFlags PVar8;
  QLoggingRule *pQVar9;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  QArrayDataPointer<QLoggingRule> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QLoggingRule> *)0x0 && where == GrowsAtEnd) {
    pDVar4 = this->d;
    if (pDVar4 == (Data *)0x0) {
      bVar7 = true;
    }
    else {
      bVar7 = 1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar7)) {
      if (pDVar4 == (Data *)0x0) {
        lVar11 = 0;
        lVar10 = 0;
      }
      else {
        lVar11 = (pDVar4->super_QArrayData).alloc;
        lVar10 = (this->size - (pDVar4->super_QArrayData).alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 3) * -0x3333333333333333;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QtPrivate::QMovableArrayOps<QLoggingRule>::reallocate
                  ((QMovableArrayOps<QLoggingRule> *)this,lVar11 + n + lVar10,Grow);
        return;
      }
      goto LAB_0024e058;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QLoggingRule *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if ((n < 1) || (local_38.ptr != (QLoggingRule *)0x0)) {
    if (this->size != 0) {
      lVar11 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar7 = true;
      }
      else {
        bVar7 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      pQVar9 = this->ptr;
      pQVar5 = pQVar9 + lVar11;
      if ((old != (QArrayDataPointer<QLoggingRule> *)0x0) || (bVar7)) {
        if ((lVar11 != 0) && (0 < lVar11)) {
          do {
            pDVar1 = (pQVar9->category).d.d;
            local_38.ptr[local_38.size].category.d.d = pDVar1;
            local_38.ptr[local_38.size].category.d.ptr = (pQVar9->category).d.ptr;
            local_38.ptr[local_38.size].category.d.size = (pQVar9->category).d.size;
            if (pDVar1 != (Data *)0x0) {
              LOCK();
              (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                   (__atomic_base<int>)
                   ((__int_type_conflict)
                    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
              UNLOCK();
            }
            local_38.ptr[local_38.size].enabled = pQVar9->enabled;
            PVar8.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
            super_QFlagsStorage<QLoggingRule::PatternFlag>.i =
                 (pQVar9->flags).super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>;
            local_38.ptr[local_38.size].messageType = pQVar9->messageType;
            local_38.ptr[local_38.size].flags =
                 (PatternFlags)
                 PVar8.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
                 super_QFlagsStorage<QLoggingRule::PatternFlag>.i;
            pQVar9 = pQVar9 + 1;
            local_38.size = local_38.size + 1;
          } while (pQVar9 < pQVar5);
        }
      }
      else if ((lVar11 != 0) && (0 < lVar11)) {
        do {
          pDVar1 = (pQVar9->category).d.d;
          (pQVar9->category).d.d = (Data *)0x0;
          local_38.ptr[local_38.size].category.d.d = pDVar1;
          pcVar2 = (pQVar9->category).d.ptr;
          (pQVar9->category).d.ptr = (char16_t *)0x0;
          local_38.ptr[local_38.size].category.d.ptr = pcVar2;
          qVar3 = (pQVar9->category).d.size;
          (pQVar9->category).d.size = 0;
          local_38.ptr[local_38.size].category.d.size = qVar3;
          PVar8.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
          super_QFlagsStorage<QLoggingRule::PatternFlag>.i =
               (pQVar9->flags).super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>;
          local_38.ptr[local_38.size].messageType = pQVar9->messageType;
          local_38.ptr[local_38.size].flags =
               (PatternFlags)
               PVar8.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
               super_QFlagsStorage<QLoggingRule::PatternFlag>.i;
          local_38.ptr[local_38.size].enabled = pQVar9->enabled;
          pQVar9 = pQVar9 + 1;
          local_38.size = local_38.size + 1;
        } while (pQVar9 < pQVar5);
      }
    }
    pDVar4 = this->d;
    pQVar5 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    puVar6 = (undefined1 *)this->size;
    this->size = local_38.size;
    local_38.d = pDVar4;
    local_38.ptr = pQVar5;
    local_38.size = (qsizetype)puVar6;
    if (old != (QArrayDataPointer<QLoggingRule> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar4;
      old->ptr = pQVar5;
      local_38.size = old->size;
      old->size = (qsizetype)puVar6;
    }
    ~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    qBadAlloc();
  }
LAB_0024e058:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }